

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<double,double,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool>
               (double *ldata,double *rdata,bool *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  ulong *puVar1;
  double dVar2;
  double dVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ulong uVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar4 = lsel->sel_vector;
      psVar5 = rsel->sel_vector;
      uVar15 = 0;
      do {
        uVar12 = uVar15;
        if (psVar4 != (sel_t *)0x0) {
          uVar12 = (ulong)psVar4[uVar15];
        }
        uVar14 = uVar15;
        if (psVar5 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar5[uVar15];
        }
        dVar2 = ldata[uVar12];
        dVar3 = rdata[uVar14];
        bVar10 = Value::IsNan<double>(dVar2);
        bVar11 = Value::IsNan<double>(dVar3);
        if (!bVar11) {
          bVar10 = bVar10 || dVar3 <= dVar2;
        }
        result_data[uVar15] = bVar10;
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
  }
  else if (count != 0) {
    psVar4 = lsel->sel_vector;
    psVar5 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar15 = 0;
    do {
      uVar12 = uVar15;
      if (psVar4 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar4[uVar15];
      }
      uVar14 = uVar15;
      if (psVar5 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar5[uVar15];
      }
      puVar6 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0))
         && ((puVar6 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))
         ) {
        dVar2 = ldata[uVar12];
        dVar3 = rdata[uVar14];
        bVar10 = Value::IsNan<double>(dVar2);
        bVar11 = Value::IsNan<double>(dVar3);
        if (!bVar11) {
          bVar10 = bVar10 || dVar3 <= dVar2;
        }
        result_data[uVar15] = bVar10;
      }
      else {
        if ((result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var9 = p_Stack_50;
          peVar8 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar8;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var9;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)uVar15 & 0x3f;
        puVar1 = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}